

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cc
# Opt level: O1

void usageExit(string *msg)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"For help:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," --help=usage       usage information");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," --help=topic       help on a topic");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," --help=--option    help on an option");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," --help             general help and a topic list");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(2);
}

Assistant:

static void
usageExit(std::string const& msg)
{
    std::cerr << std::endl
              << whoami << ": " << msg << std::endl
              << std::endl
              << "For help:" << std::endl
              << "  " << whoami << " --help=usage       usage information" << std::endl
              << "  " << whoami << " --help=topic       help on a topic" << std::endl
              << "  " << whoami << " --help=--option    help on an option" << std::endl
              << "  " << whoami << " --help             general help and a topic list" << std::endl
              << std::endl;
    exit(QPDFJob::EXIT_ERROR);
}